

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  uint uVar1;
  _Alloc_hider _Var2;
  char *pcVar3;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_48;
  char *local_38 [2];
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_28;
  
  local_48.kind_ = Unset;
  local_48.n_written_ = 0;
  local_48.wrt_ = wrt;
  pcVar3 = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
  key._M_str = (char *)0x8;
  key._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key);
  if (local_58.kind_ == Unset) {
    local_58.kind_ = Scalar;
  }
  local_38[0] = pcVar3;
  fmt::BasicWriter<char>::write
            (&(local_58.wrt_)->super_BasicWriter<char>,0x49f13a,(void *)0xa,(size_t)local_38);
  local_58.n_written_ = local_58.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  key_00._M_str = (char *)0x5;
  key_00._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key_00)
  ;
  if (local_58.kind_ == Unset) {
    local_58.kind_ = Scalar;
  }
  local_38[0] = (char *)(ulong)(uint)i_con;
  fmt::BasicWriter<char>::write
            (&(local_58.wrt_)->super_BasicWriter<char>,0x4b9e95,(void *)0x2,(size_t)local_38);
  local_58.n_written_ = local_58.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  _Var2._M_p = (cnt->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_.
               _M_dataplus._M_p;
  if (*_Var2._M_p != '\0') {
    key_01._M_str = (char *)0x4;
    key_01._M_len = (size_t)&local_48;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&local_58,key_01);
    if (local_58.kind_ == Unset) {
      local_58.kind_ = Scalar;
    }
    local_38[0] = _Var2._M_p;
    fmt::BasicWriter<char>::write
              (&(local_58.wrt_)->super_BasicWriter<char>,0x49f13a,(void *)0xa,(size_t)local_38);
    local_58.n_written_ = local_58.n_written_ + 1;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  }
  uVar1 = cnt->depth_;
  key_02._M_str = (char *)0x5;
  key_02._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_58,key_02)
  ;
  if (local_58.kind_ == Unset) {
    local_58.kind_ = Scalar;
  }
  local_38[0] = (char *)(ulong)uVar1;
  fmt::BasicWriter<char>::write
            (&(local_58.wrt_)->super_BasicWriter<char>,0x4b9e95,(void *)0x2,(size_t)local_38);
  local_58.n_written_ = local_58.n_written_ + 1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
  key_03._M_str = (char *)0x4;
  key_03._M_len = (size_t)&local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_28,key_03)
  ;
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>
            (&local_28,
             (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>
              *)cnt);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_28);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_48);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }